

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

Symbol * findlocsymbol(GlobalVars *gv,ObjectUnit *ou,char *name)

{
  long lVar1;
  Symbol *pSVar2;
  int iVar3;
  unsigned_long uVar4;
  char *in_RDX;
  long in_RSI;
  Symbol **chain;
  Symbol *sym;
  Symbol **local_30;
  
  lVar1 = *(long *)(in_RSI + 0x48);
  uVar4 = elf_hash(in_RDX);
  local_30 = (Symbol **)(lVar1 + (uVar4 & 0x1f) * 8);
  while( true ) {
    pSVar2 = *local_30;
    if (pSVar2 == (Symbol *)0x0) {
      return (Symbol *)0x0;
    }
    iVar3 = strcmp(pSVar2->name,in_RDX);
    if (iVar3 == 0) break;
    local_30 = &pSVar2->obj_chain;
  }
  return pSVar2;
}

Assistant:

struct Symbol *findlocsymbol(struct GlobalVars *gv,struct ObjectUnit *ou,
                             const char *name)
/* find a symbol which is local to the provided ObjectUnit */
{
  struct Symbol *sym;
  struct Symbol **chain = &ou->objsyms[elf_hash(name)%OBJSYMHTABSIZE];

  while (sym = *chain) {
    if (!strcmp(sym->name,name))
      return sym;
    chain = &sym->obj_chain;
  }
  return NULL;
}